

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdconntable.c
# Opt level: O0

char * searchForStdBondingPartner(char *resname,char *atomname,int isAhydrogen)

{
  int iVar1;
  char *pcVar2;
  char local_40;
  undefined1 local_3c;
  char *naALTlist;
  char *p;
  undefined1 local_20;
  char local_1f;
  char querystring [10];
  int isAhydrogen_local;
  char *atomname_local;
  char *resname_local;
  
  if ((resname == (char *)0x0) || (atomname == (char *)0x0)) {
    naALTlist = (char *)0x0;
  }
  else {
    querystring._2_4_ = isAhydrogen;
    unique0x10000251 = atomname;
    if (*resname == '\0') {
      p._4_1_ = 0x20;
      p._3_1_ = 0x20;
      p._2_1_ = 0x20;
    }
    else {
      iVar1 = toupper((int)*resname);
      p._2_1_ = (undefined1)iVar1;
      if (resname[1] == '\0') {
        p._4_1_ = 0x20;
        p._3_1_ = 0x20;
      }
      else {
        iVar1 = toupper((int)resname[1]);
        p._3_1_ = (undefined1)iVar1;
        if (resname[2] == '\0') {
          local_3c = 0x20;
        }
        else {
          iVar1 = toupper((int)resname[2]);
          local_3c = (undefined1)iVar1;
        }
        p._4_1_ = local_3c;
      }
    }
    p._5_1_ = 0x3a;
    if (*stack0xffffffffffffffe8 == '\0') {
      p._7_1_ = ' ';
      p._6_1_ = ' ';
      local_1f = ' ';
      local_20 = 0x20;
    }
    else {
      iVar1 = toupper((int)*stack0xffffffffffffffe8);
      p._6_1_ = (char)iVar1;
      if (stack0xffffffffffffffe8[1] == '\0') {
        local_1f = ' ';
        local_20 = 0x20;
        p._7_1_ = ' ';
      }
      else {
        iVar1 = toupper((int)stack0xffffffffffffffe8[1]);
        p._7_1_ = (char)iVar1;
        if (stack0xffffffffffffffe8[2] == '\0') {
          local_1f = ' ';
          local_20 = 0x20;
        }
        else {
          iVar1 = toupper((int)stack0xffffffffffffffe8[2]);
          local_20 = (undefined1)iVar1;
          if (stack0xffffffffffffffe8[3] == '\0') {
            local_40 = ' ';
          }
          else {
            iVar1 = toupper((int)stack0xffffffffffffffe8[3]);
            local_40 = (char)iVar1;
          }
          local_1f = local_40;
        }
      }
    }
    querystring[0] = '\0';
    if (querystring._2_4_ != 0) {
      if ((p._6_1_ == 'D') && (local_1f != ' ')) {
        p._6_1_ = 'H';
      }
      else if ((p._6_1_ != 'H') && (p._7_1_ == 'D')) {
        p._7_1_ = 'H';
      }
    }
    naALTlist = SearchStdResConnTable((char *)((long)&p + 2));
    if (naALTlist == (char *)0x0) {
      p._5_1_ = 0;
      pcVar2 = strstr(":GUA:GTP:GDP:GMP:GSP:ADE:ATP:ADP:AMP:CYT:CTP:CDP:CMP:URA:UTP:UDP:UMP:THY:TTP:TDP:TMP: DA: DT: DC: DG: AR: UR: TR: CR: GR:"
                      ,(char *)((long)&p + 2));
      if (pcVar2 != (char *)0x0) {
        pcVar2 = strstr(":GUA:GTP:GDP:GMP:GSP: DG: GR:",(char *)((long)&p + 2));
        if (pcVar2 == (char *)0x0) {
          pcVar2 = strstr(":ADE:ATP:ADP:AMP: DA: AR:",(char *)((long)&p + 2));
          if (pcVar2 == (char *)0x0) {
            pcVar2 = strstr(":CYT:CTP:CDP:CMP: DC: CR:",(char *)((long)&p + 2));
            if (pcVar2 == (char *)0x0) {
              pcVar2 = strstr(":URA:UTP:UDP:UMP: UR:",(char *)((long)&p + 2));
              if (pcVar2 == (char *)0x0) {
                pcVar2 = strstr(":THY:TTP:TDP:TMP: DT: TR:",(char *)((long)&p + 2));
                if (pcVar2 == (char *)0x0) {
                  p._4_1_ = 0x20;
                }
                else {
                  p._4_1_ = 0x54;
                }
              }
              else {
                p._4_1_ = 0x55;
              }
            }
            else {
              p._4_1_ = 0x43;
            }
          }
          else {
            p._4_1_ = 0x41;
          }
        }
        else {
          p._4_1_ = 0x47;
        }
        p._3_1_ = 0x20;
        p._2_1_ = 0x20;
        p._5_1_ = 0x3a;
        naALTlist = SearchStdResConnTable((char *)((long)&p + 2));
      }
    }
  }
  return naALTlist;
}

Assistant:

char * searchForStdBondingPartner(char *resname, char *atomname, int isAhydrogen) {
   char querystring[10], *p;

   /* a large part of this routine is devoted to converting residue names */
   /* and atom names into a search pattern. This pattern is 8 chars long  */
   /* and all uppercase. It has a colon as the forth character, separating*/
   /* residue name from atom name. Deuterum is converted to hydrogen.     */

   if (resname && atomname) {
      if (resname[0]) {
	 querystring[0] = toupper(resname[0]);
	 if (resname[1]) {
	    querystring[1] = toupper(resname[1]);
	    querystring[2] = resname[2] ? toupper(resname[2]) : ' ';
	 }
	 else { querystring[1] = querystring[2] = ' '; }
      }
      else { querystring[0] = querystring[1] = querystring[2] = ' '; }
      querystring[3] = ':';
      if (atomname[0]) {
	 querystring[4] = toupper(atomname[0]);
	 if (atomname[1]) {
	    querystring[5] = toupper(atomname[1]);
	    if (atomname[2]) {
	       querystring[6] = toupper(atomname[2]);
	       querystring[7] = atomname[3] ? toupper(atomname[3]) : ' ';
	    }
	    else { querystring[6] = querystring[7] = ' '; }
	 }
	 else { querystring[5] = querystring[6] = querystring[7] = ' '; }
      }
      else {
	 querystring[4] = querystring[5] = ' ';
	 querystring[6] = querystring[7] = ' ';
      }
      querystring[8] = '\0';

      if (isAhydrogen) {
	 /* because we know atomname is for a hydrogen atom we can */
	 /* make the following fixup for deuterium atoms           */
	 if ((querystring[4] == 'D') && (querystring[7] != ' ')) {
	    querystring[4] = 'H';
	 }
	 else if ((querystring[4] != 'H') && (querystring[5] == 'D')) {
	    querystring[5] = 'H';
	 }
      }

      p = SearchStdResConnTable(querystring);

      if (p == NULL) {
	 /* if failed because of a non-std nucleic acid residue name */
	 /* convert to "..X" and retry                               */

	 char *naALTlist = ":GUA:GTP:GDP:GMP:GSP:ADE:ATP:ADP:AMP:CYT:CTP:CDP:CMP:URA:UTP:UDP:UMP:THY:TTP:TDP:TMP: DA: DT: DC: DG: AR: UR: TR: CR: GR:";

	 querystring[3] = '\0'; /* temporarily look at just the first three chars */
	 if (strstr(naALTlist, querystring)) {
	    /* fixup common alternate nucleic acid residue names */
	         if(strstr(":GUA:GTP:GDP:GMP:GSP: DG: GR:", querystring)) {
	       querystring[2] = 'G';
	    }
	    else if(strstr(":ADE:ATP:ADP:AMP: DA: AR:",     querystring)) {
	       querystring[2] = 'A';
	    }
	    else if(strstr(":CYT:CTP:CDP:CMP: DC: CR:",     querystring)) {
	       querystring[2] = 'C';
	    }
	    else if(strstr(":URA:UTP:UDP:UMP: UR:",     querystring)) {
	       querystring[2] = 'U';
	    }
	    else if(strstr(":THY:TTP:TDP:TMP: DT: TR:",     querystring)) {
	       querystring[2] = 'T';
	    }
	    else { querystring[2] = ' '; }

	    querystring[0] = querystring[1] = ' '; /* i.e., blank-blank-[GACUT] */
				    /* put the string back together */
	    querystring[3] = ':';

	    p = SearchStdResConnTable(querystring); /* second time is a charm */
	 }
      }
   }
   else { p = NULL; }
   return p;
}